

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapProxyInfo(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  SnapProxyInfo *pSVar1;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar2;
  RecyclableObject *local_48;
  RecyclableObject *local_40;
  RecyclableObject *targetObj;
  RecyclableObject *handlerObj;
  SnapProxyInfo *proxyInfo;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapProxyInfo*,(TTD::NSSnapObjects::SnapObjectType)27>
                     (snpObject);
  if (pSVar1->HandlerId == 0) {
    local_40 = (RecyclableObject *)0x0;
  }
  else {
    local_40 = InflateMap::LookupObject(inflator,pSVar1->HandlerId);
  }
  if (pSVar1->TargetId == 0) {
    local_48 = (RecyclableObject *)0x0;
  }
  else {
    local_48 = InflateMap::LookupObject(inflator,pSVar1->TargetId);
  }
  this_00 = Js::ScriptContext::GetLibrary(this);
  pRVar2 = Js::JavascriptLibrary::CreateProxy_TTD(this_00,local_40,local_48);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapProxyInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            SnapProxyInfo* proxyInfo = SnapObjectGetAddtlInfoAs<SnapProxyInfo*, SnapObjectType::SnapProxyObject>(snpObject);

            Js::RecyclableObject* handlerObj = (proxyInfo->HandlerId != TTD_INVALID_PTR_ID) ? inflator->LookupObject(proxyInfo->HandlerId) : nullptr;
            Js::RecyclableObject* targetObj = (proxyInfo->TargetId != TTD_INVALID_PTR_ID) ? inflator->LookupObject(proxyInfo->TargetId) : nullptr;

            return  ctx->GetLibrary()->CreateProxy_TTD(handlerObj, targetObj);
        }